

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O0

void __thiscall
tinyusdz::TypedTimeSamples<tinyusdz::value::AssetPath>::add_sample
          (TypedTimeSamples<tinyusdz::value::AssetPath> *this,double t,AssetPath *v)

{
  undefined1 local_70 [8];
  Sample s;
  AssetPath *v_local;
  double t_local;
  TypedTimeSamples<tinyusdz::value::AssetPath> *this_local;
  
  s._72_8_ = v;
  Sample::Sample((Sample *)local_70);
  local_70 = (undefined1  [8])t;
  tinyusdz::value::AssetPath::operator=((AssetPath *)&s,(AssetPath *)s._72_8_);
  ::std::
  vector<tinyusdz::TypedTimeSamples<tinyusdz::value::AssetPath>::Sample,std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::AssetPath>::Sample>>
  ::emplace_back<tinyusdz::TypedTimeSamples<tinyusdz::value::AssetPath>::Sample&>
            ((vector<tinyusdz::TypedTimeSamples<tinyusdz::value::AssetPath>::Sample,std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::AssetPath>::Sample>>
              *)this,(Sample *)local_70);
  this->_dirty = true;
  Sample::~Sample((Sample *)local_70);
  return;
}

Assistant:

void add_sample(const double t, const T &v) {
    Sample s;
    s.t = t;
    s.value = v;
    _samples.emplace_back(s);
    _dirty = true;
  }